

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O2

bool __thiscall
cmCTestHandlerCommand::InitialPass
          (cmCTestHandlerCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  pointer ppcVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  cmCTest *pcVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  long *plVar8;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 collapse;
  string *this_01;
  uint uVar9;
  ulong uVar10;
  allocator local_209;
  string current_dir;
  string local_1e8;
  char *local_1c8 [4];
  ostringstream e;
  undefined4 extraout_var;
  
  this_00 = &this->Values;
  ppcVar1 = (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar1) {
    (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar1;
  }
  _e = (char *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (this_00,this->Last,(value_type *)&e);
  this->ArgumentDoing = 0;
  uVar9 = 0;
  while( true ) {
    uVar10 = (ulong)uVar9;
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar10)
    break;
    iVar5 = (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xd])
                      (this,pbVar2 + uVar10);
    if (((char)iVar5 == '\0') &&
       (iVar5 = (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xe])
                          (this,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar10),
       (char)iVar5 == '\0')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar7 = std::operator<<((ostream *)&e,"called with unknown argument \"");
      poVar7 = std::operator<<(poVar7,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar10));
      std::operator<<(poVar7,"\".");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&current_dir);
      goto LAB_0030a462;
    }
    uVar9 = uVar9 + 1;
    if (this->ArgumentDoing == 1) {
      return false;
    }
  }
  pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
  std::__cxx11::string::string((string *)&e,"CTEST_CONFIGURATION_TYPE",(allocator *)&current_dir);
  pcVar6 = cmMakefile::GetDefinition(pcVar3,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (pcVar6 != (char *)0x0) {
    cmCTest::SetConfigType((this->super_cmCTestCommand).CTest,pcVar6);
  }
  pcVar6 = (this_00->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
           super__Vector_impl_data._M_start[2];
  if (pcVar6 == (char *)0x0) {
    pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::__cxx11::string::string((string *)&e,"CTEST_BINARY_DIRECTORY",(allocator *)&current_dir);
    pcVar6 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (pcVar6 == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar7 = std::operator<<((ostream *)&e,"CTEST_BINARY_DIRECTORY not set");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar4 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x5d,current_dir._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&current_dir);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      goto LAB_0030a0f2;
    }
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::string::string((string *)&current_dir,pcVar6,(allocator *)&local_1e8);
    cmsys::SystemTools::CollapseFullPath((string *)&e,&current_dir);
    cmCTest::SetCTestConfiguration(pcVar4,"BuildDirectory",_e,this->Quiet);
  }
  else {
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::string::string((string *)&current_dir,pcVar6,(allocator *)&local_1e8);
    cmsys::SystemTools::CollapseFullPath((string *)&e,&current_dir);
    cmCTest::SetCTestConfiguration(pcVar4,"BuildDirectory",_e,this->Quiet);
  }
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&current_dir);
LAB_0030a0f2:
  if ((this_00->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
      super__Vector_impl_data._M_start[3] == (char *)0x0) {
    pcVar4 = (this->super_cmCTestCommand).CTest;
    pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::__cxx11::string::string
              ((string *)&local_1e8,"CTEST_SOURCE_DIRECTORY",(allocator *)local_1c8);
    pcVar6 = cmMakefile::GetSafeDefinition(pcVar3,&local_1e8);
    std::__cxx11::string::string((string *)&current_dir,pcVar6,&local_209);
    cmsys::SystemTools::CollapseFullPath((string *)&e,&current_dir);
    cmCTest::SetCTestConfiguration(pcVar4,"SourceDirectory",_e,this->Quiet);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&current_dir);
    this_01 = &local_1e8;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar7 = std::operator<<((ostream *)&e,"Set source directory to: ");
    poVar7 = std::operator<<(poVar7,(this_00->
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                                    ._M_impl.super__Vector_impl_data._M_start[3]);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                 ,99,current_dir._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&current_dir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::string::string
              ((string *)&current_dir,
               (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_start[3],(allocator *)&local_1e8);
    cmsys::SystemTools::CollapseFullPath((string *)&e,&current_dir);
    cmCTest::SetCTestConfiguration(pcVar4,"SourceDirectory",_e,this->Quiet);
    std::__cxx11::string::~string((string *)&e);
    this_01 = &current_dir;
  }
  std::__cxx11::string::~string((string *)this_01);
  pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
  std::__cxx11::string::string((string *)&e,"CTEST_CHANGE_ID",(allocator *)&current_dir);
  pcVar6 = cmMakefile::GetDefinition(pcVar3,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (pcVar6 != (char *)0x0) {
    cmCTest::SetCTestConfiguration((this->super_cmCTestCommand).CTest,"ChangeId",pcVar6,this->Quiet)
    ;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar7 = std::operator<<((ostream *)&e,"Initialize handler");
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar4 = (this->super_cmCTestCommand).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
               ,0x76,current_dir._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&current_dir);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  iVar5 = (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xc])(this);
  plVar8 = (long *)CONCAT44(extraout_var,iVar5);
  if (plVar8 != (long *)0x0) {
    *(bool *)(plVar8 + 1) = this->AppendXML;
    (**(code **)(*plVar8 + 0x20))(plVar8,(this->super_cmCTestCommand).super_cmCommand.Makefile);
    pcVar6 = (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[4];
    collapse = extraout_DL;
    if (pcVar6 != (char *)0x0) {
      pcVar4 = (this->super_cmCTestCommand).CTest;
      if ((pcVar4->DropSiteCDash == false) && (pcVar4->DartVersion < 2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar7 = std::operator<<((ostream *)&e,
                                 "Dart before version 2.0 does not support collecting submissions.")
        ;
        poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
        poVar7 = std::operator<<(poVar7,
                                 "Please upgrade the server to Dart 2 or higher, or do not use SUBMIT_INDEX."
                                );
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar4 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                     ,0x8b,current_dir._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&current_dir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        collapse = extraout_DL_00;
      }
      else {
        iVar5 = atoi(pcVar6);
        *(int *)(plVar8 + 0x12) = iVar5;
        collapse = extraout_DL_01;
      }
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&current_dir,(SystemTools *)0x1,(bool)collapse);
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::string::string((string *)&local_1e8,"BuildDirectory",(allocator *)local_1c8);
    cmCTest::GetCTestConfiguration((string *)&e,pcVar4,&local_1e8);
    cmsys::SystemTools::ChangeDirectory((string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_1e8);
    iVar5 = (**(code **)(*plVar8 + 0x28))(plVar8);
    pcVar6 = (this_00->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_start[1];
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::ostream::operator<<(&e,iVar5);
      pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::__cxx11::string::string
                ((string *)&local_1e8,
                 (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[1],&local_209);
      std::__cxx11::stringbuf::str();
      cmMakefile::AddDefinition(pcVar3,&local_1e8,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    cmsys::SystemTools::ChangeDirectory(&current_dir);
    std::__cxx11::string::~string((string *)&current_dir);
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar7 = std::operator<<((ostream *)&e,"Cannot instantiate test handler ");
  (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xb])
            (&current_dir,this);
  poVar7 = std::operator<<(poVar7,(string *)&current_dir);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)&current_dir);
  pcVar4 = (this->super_cmCTestCommand).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,6,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
               ,0x7c,current_dir._M_dataplus._M_p,false);
LAB_0030a462:
  std::__cxx11::string::~string((string *)&current_dir);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return false;
}

Assistant:

bool cmCTestHandlerCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  // Allocate space for argument values.
  this->Values.clear();
  this->Values.resize(this->Last, 0);

  // Process input arguments.
  this->ArgumentDoing = ArgumentDoingNone;
  for(unsigned int i=0; i < args.size(); ++i)
    {
    // Check this argument.
    if(!this->CheckArgumentKeyword(args[i]) &&
       !this->CheckArgumentValue(args[i]))
      {
      std::ostringstream e;
      e << "called with unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }

    // Quit if an argument is invalid.
    if(this->ArgumentDoing == ArgumentDoingError)
      {
      return false;
      }
    }

  // Set the config type of this ctest to the current value of the
  // CTEST_CONFIGURATION_TYPE script variable if it is defined.
  // The current script value trumps the -C argument on the command
  // line.
  const char* ctestConfigType =
    this->Makefile->GetDefinition("CTEST_CONFIGURATION_TYPE");
  if (ctestConfigType)
    {
    this->CTest->SetConfigType(ctestConfigType);
    }

  if ( this->Values[ct_BUILD] )
    {
    this->CTest->SetCTestConfiguration("BuildDirectory",
      cmSystemTools::CollapseFullPath(
        this->Values[ct_BUILD]).c_str(), this->Quiet);
    }
  else
    {
    const char* bdir =
      this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");
    if(bdir)
      {
      this->
        CTest->SetCTestConfiguration("BuildDirectory",
          cmSystemTools::CollapseFullPath(bdir).c_str(), this->Quiet);
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "CTEST_BINARY_DIRECTORY not set" << std::endl;);
      }
    }
  if ( this->Values[ct_SOURCE] )
    {
    cmCTestLog(this->CTest, DEBUG,
      "Set source directory to: " << this->Values[ct_SOURCE] << std::endl);
    this->CTest->SetCTestConfiguration("SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Values[ct_SOURCE]).c_str(), this->Quiet);
    }
  else
    {
    this->CTest->SetCTestConfiguration("SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY")).c_str(),
      this->Quiet);
    }

  if(const char* changeId =
     this->Makefile->GetDefinition("CTEST_CHANGE_ID"))
    {
    this->CTest->SetCTestConfiguration("ChangeId", changeId, this->Quiet);
    }

  cmCTestLog(this->CTest, DEBUG, "Initialize handler" << std::endl;);
  cmCTestGenericHandler* handler = this->InitializeHandler();
  if ( !handler )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot instantiate test handler " << this->GetName()
               << std::endl);
    return false;
    }

  handler->SetAppendXML(this->AppendXML);

  handler->PopulateCustomVectors(this->Makefile);
  if ( this->Values[ct_SUBMIT_INDEX] )
    {
    if(!this->CTest->GetDropSiteCDash() && this->CTest->GetDartVersion() <= 1)
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Dart before version 2.0 does not support collecting submissions."
        << std::endl
        << "Please upgrade the server to Dart 2 or higher, or do not use "
        "SUBMIT_INDEX." << std::endl);
      }
    else
      {
      handler->SetSubmitIndex(atoi(this->Values[ct_SUBMIT_INDEX]));
      }
    }
  std::string current_dir = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(
    this->CTest->GetCTestConfiguration("BuildDirectory"));
  int res = handler->ProcessHandler();
  if ( this->Values[ct_RETURN_VALUE] && *this->Values[ct_RETURN_VALUE])
    {
    std::ostringstream str;
    str << res;
    this->Makefile->AddDefinition(
      this->Values[ct_RETURN_VALUE], str.str().c_str());
    }
  cmSystemTools::ChangeDirectory(current_dir);
  return true;
}